

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O3

lua_Integer lua_tointeger(lua_State *L,int idx)

{
  uint32_t *puVar1;
  int iVar2;
  TValue *o;
  lua_Integer lVar3;
  TValue tmp;
  TValue local_10;
  
  o = index2adr(L,idx);
  if ((o->field_2).it < 0xfffeffff) {
LAB_0010b007:
    lVar3 = (lua_Integer)o->n;
  }
  else {
    if ((o->field_2).it == 0xfffffffb) {
      puVar1 = &(o->u32).lo;
      o = &local_10;
      iVar2 = lj_strscan_num((GCstr *)(ulong)*puVar1,o);
      if (iVar2 != 0) goto LAB_0010b007;
    }
    lVar3 = 0;
  }
  return lVar3;
}

Assistant:

LUA_API lua_Integer lua_tointeger(lua_State *L, int idx)
{
  cTValue *o = index2adr(L, idx);
  TValue tmp;
  lua_Number n;
  if (LJ_LIKELY(tvisint(o))) {
    return intV(o);
  } else if (LJ_LIKELY(tvisnum(o))) {
    n = numV(o);
  } else {
    if (!(tvisstr(o) && lj_strscan_number(strV(o), &tmp)))
      return 0;
    if (tvisint(&tmp))
      return intV(&tmp);
    n = numV(&tmp);
  }
#if LJ_64
  return (lua_Integer)n;
#else
  return lj_num2int(n);
#endif
}